

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O0

void __thiscall wabt::interp::Istream::EmitInternal<v128>(Istream *this,v128 val)

{
  Offset offset;
  Istream *this_local;
  v128 val_local;
  
  offset = end(this);
  EmitAt<v128>(this,offset,val);
  return;
}

Assistant:

void WABT_VECTORCALL Istream::EmitInternal(T val) {
  EmitAt(end(), val);
}